

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conjunction.h
# Opt level: O2

ptr<Value> __thiscall
Conjunction::asIntegers(Conjunction *this,longlong leftOperand,longlong rightOperand)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  Operation local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<Boolean,bool&>((bool *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Operation)._vptr_Operation = local_18._vptr_Operation;
  this[1].super_Operation._vptr_Operation = (_func_int **)_Var1._M_pi;
  local_18._vptr_Operation = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asIntegers(long long leftOperand, long long rightOperand) override {
        return make<Boolean>(leftOperand && rightOperand);
    }